

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

char * copystring(char *s)

{
  size_t sVar1;
  size_t len;
  char *b;
  char *s_local;
  
  if (s == (char *)0x0) {
    len = (size_t)operator_new__(1);
    *(undefined1 *)len = 0;
  }
  else {
    sVar1 = strlen(s);
    len = (size_t)operator_new__(sVar1 + 1);
    memcpy((void *)len,s,sVar1 + 1);
  }
  return (char *)len;
}

Assistant:

char *copystring (const char *s)
{
	char *b;
	if (s)
	{
		size_t len = strlen (s) + 1;
		b = new char[len];
		memcpy (b, s, len);
	}
	else
	{
		b = new char[1];
		b[0] = '\0';
	}
	return b;
}